

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

void __thiscall GGSock::Communicator::Data::Data(Data *this,bool startOwnWorker)

{
  _Rb_tree_header *p_Var1;
  thread local_40;
  anon_class_8_1_8991fb9c_for__M_head_impl local_38;
  
  this->isServer = true;
  this->isListening = false;
  this->isConnected = false;
  this->isConnecting = false;
  this->isRunning = false;
  this->timeoutListen_ms = 0;
  this->timeoutConnect_ms = 0;
  this->sd = -1;
  this->sdpeer = -1;
  this->max_sd = -1;
  this->offsetReceive = 0;
  this->leftToReceive = 0;
  this->lastMessageType = 0xffff;
  this->rbHead = 0;
  this->rbEnd = 0;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_128UL>
  ::array(&this->ringBufferSend);
  (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->messageCallback)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->messageCallback)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->messageCallback)._M_t._M_impl.super__Rb_tree_header;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->mutexSend).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutexSend).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutexSend).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutexSend).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mutexSend).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->worker)._M_id._M_thread = 0;
  *(undefined8 *)&(this->errorCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->errorCallback).super__Function_base._M_functor + 8) = 0;
  (this->errorCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->errorCallback)._M_invoker = (_Invoker_type)0x0;
  (this->messageCallback)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->messageCallback)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->messageCallback)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (Data::isFirst == true) {
    signal(0xd,(__sighandler_t)0x1);
    Data::isFirst = false;
  }
  std::mutex::lock(&this->mutex);
  local_40._M_id._M_thread._0_1_ = 0;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->bufferDataRecv,0x40000,(value_type *)&local_40);
  if (startOwnWorker) {
    this->isRunning = true;
    local_38.this = this;
    std::thread::thread<GGSock::Communicator::Data::Data(bool)::_lambda()_1_,,void>
              (&local_40,&local_38);
    std::thread::operator=(&this->worker,&local_40);
    std::thread::~thread(&local_40);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

Data(bool startOwnWorker) {
            // todo : maybe move this to a static method
            static bool isFirst = true;
            if (isFirst) {
#ifdef _WIN32
                // Initialize Winsock
                WSADATA wsaData;
                int iResult = WSAStartup(MAKEWORD(2,2), &wsaData);
                if (iResult != 0) {
                    printf("WSAStartup failed with error: %d\n", iResult);
                    return;
                }
#endif

#ifndef _WIN32
                // this is needed to avoid program crash upon sending data to disconnected clients
                signal(SIGPIPE, SIG_IGN);
#endif

                isFirst = false;
            }

            std::lock_guard<std::mutex> lock(mutex);

            bufferDataRecv.resize(256*1024, 0);

            if (startOwnWorker) {
                isRunning = true;
                worker = std::thread([this]() {
                    while (isRunning) {
                        update();
                        std::this_thread::sleep_for(std::chrono::milliseconds(1));
                    }
                });
            }
        }